

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureFunctionTests.cpp
# Opt level: O3

void vkt::sr::anon_unknown_0::evalTexture3DGrad(ShaderEvalContext *c,TexLookupParams *p)

{
  float fVar1;
  float fVar2;
  float fVar3;
  Texture3D *pTVar4;
  uint uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar13;
  float fVar14;
  undefined1 auVar12 [16];
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float local_28;
  float fStack_24;
  float fStack_20;
  float fStack_1c;
  
  pTVar4 = c->textures[0].tex3D;
  fVar6 = (float)pTVar4->m_width;
  fVar1 = c->in[0].m_data[0];
  fVar15 = (float)pTVar4->m_height;
  fVar2 = c->in[0].m_data[1];
  fVar10 = (float)pTVar4->m_depth;
  fVar3 = c->in[0].m_data[2];
  fVar7 = fVar6 * c->in[1].m_data[0];
  fVar8 = fVar6 * c->in[2].m_data[0];
  fVar9 = fVar6 * c->in[1].m_data[2];
  fVar6 = fVar6 * c->in[1].m_data[3];
  fVar16 = fVar15 * c->in[1].m_data[1];
  fVar17 = fVar15 * c->in[2].m_data[1];
  fVar18 = fVar15 * c->in[1].m_data[3];
  fVar15 = fVar15 * c->in[2].m_data[0];
  fVar11 = fVar10 * c->in[1].m_data[2];
  fVar13 = fVar10 * c->in[2].m_data[2];
  fVar14 = fVar10 * c->in[2].m_data[0];
  fVar10 = fVar10 * c->in[2].m_data[1];
  auVar12._0_4_ = fVar11 * fVar11 + fVar7 * fVar7 + fVar16 * fVar16;
  auVar12._4_4_ = fVar13 * fVar13 + fVar8 * fVar8 + fVar17 * fVar17;
  auVar12._8_4_ = fVar14 * fVar14 + fVar9 * fVar9 + fVar18 * fVar18;
  auVar12._12_4_ = fVar10 * fVar10 + fVar6 * fVar6 + fVar15 * fVar15;
  auVar12 = sqrtps(auVar12,auVar12);
  uVar5 = -(uint)(auVar12._4_4_ <= auVar12._0_4_);
  fVar6 = logf((float)(~uVar5 & (uint)auVar12._4_4_ | (uint)auVar12._0_4_ & uVar5));
  pTVar4 = c->textures[0].tex3D;
  tcu::sampleLevelArray3D
            ((tcu *)&local_28,(pTVar4->m_view).m_levels,(pTVar4->m_view).m_numLevels,
             &c->textures[0].sampler,fVar1,fVar2,fVar3,fVar6 * 1.442695);
  fVar1 = (p->scale).m_data[1];
  fVar2 = (p->scale).m_data[2];
  fVar3 = (p->scale).m_data[3];
  fVar6 = (p->bias).m_data[1];
  fVar7 = (p->bias).m_data[2];
  fVar8 = (p->bias).m_data[3];
  (c->color).m_data[0] = (p->scale).m_data[0] * local_28 + (p->bias).m_data[0];
  (c->color).m_data[1] = fVar1 * fStack_24 + fVar6;
  (c->color).m_data[2] = fVar2 * fStack_20 + fVar7;
  (c->color).m_data[3] = fVar3 * fStack_1c + fVar8;
  return;
}

Assistant:

static void		evalTexture3DGrad			(ShaderEvalContext& c, const TexLookupParams& p)	{ c.color = texture3D(c, c.in[0].x(), c.in[0].y(), c.in[0].z(), computeLodFromGrad3D(c))*p.scale + p.bias; }